

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deArrayBuffer.hpp
# Opt level: O0

void __thiscall
de::ArrayBuffer<unsigned_char,_1UL,_1UL>::setStorage
          (ArrayBuffer<unsigned_char,_1UL,_1UL> *this,size_t numElements)

{
  undefined1 local_28 [8];
  ArrayBuffer<unsigned_char,_1UL,_1UL> newBuffer;
  size_t numElements_local;
  ArrayBuffer<unsigned_char,_1UL,_1UL> *this_local;
  
  newBuffer.m_cap = numElements;
  ArrayBuffer((ArrayBuffer<unsigned_char,_1UL,_1UL> *)local_28,numElements);
  swap(this,(ArrayBuffer<unsigned_char,_1UL,_1UL> *)local_28);
  ~ArrayBuffer((ArrayBuffer<unsigned_char,_1UL,_1UL> *)local_28);
  return;
}

Assistant:

void ArrayBuffer<T,Alignment,Stride>::setStorage (size_t numElements)
{
	// create new buffer of the wanted size, swap to it
	ArrayBuffer<T,Alignment,Stride> newBuffer(numElements);
	swap(newBuffer);
}